

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_GIF_Image.cxx
# Opt level: O3

void __thiscall Fl_GIF_Image::Fl_GIF_Image(Fl_GIF_Image *this,char *infname)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  FILE *__stream;
  size_t sVar15;
  char *pcVar16;
  char **ppcVar17;
  char *pcVar18;
  byte *pbVar19;
  byte bVar20;
  char cVar21;
  int iVar22;
  char *pcVar23;
  uint uVar24;
  ulong uVar25;
  char *pcVar26;
  uint uVar27;
  int iVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  uint uVar32;
  uint uVar33;
  ulong uVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  uint uVar38;
  ulong uVar39;
  uchar Blue [256];
  uchar Green [256];
  uchar Red [256];
  uchar remap [256];
  uchar used [256];
  short Prefix [4096];
  uchar Suffix [4096];
  uint local_38ec;
  uint local_38c8;
  char *local_3898;
  byte local_3848 [256];
  byte local_3748 [256];
  byte local_3648 [256];
  byte abStack_3548 [256];
  char local_3448 [1040];
  undefined2 local_3038;
  char local_3036;
  char local_3035;
  char local_3034;
  char local_3033;
  char local_1038 [4104];
  
  Fl_Pixmap::Fl_Pixmap(&this->super_Fl_Pixmap,(char **)0x0);
  (this->super_Fl_Pixmap).super_Fl_Image._vptr_Fl_Image = (_func_int **)&PTR__Fl_Pixmap_0027baa8;
  __stream = (FILE *)fl_fopen(infname,"rb");
  if (__stream == (FILE *)0x0) {
    (*Fl::error)("Fl_GIF_Image: Unable to open %s!",infname);
    (this->super_Fl_Pixmap).super_Fl_Image.ld_ = -2;
  }
  else {
    sVar15 = fread(&local_3038,1,6,__stream);
    if (sVar15 < 6) {
      fclose(__stream);
      iVar37 = -2;
    }
    else {
      if ((((char)local_3038 == 'G') && (local_3038._1_1_ == 'I')) && (local_3036 == 'F')) {
        if ((local_3033 != 'a' || local_3035 != '8') || '9' < local_3034) {
          (*Fl::warning)("%s is version %c%c%c.",infname,(ulong)(uint)(int)local_3035,
                         (ulong)(uint)(int)local_3034,(ulong)(uint)(int)local_3033);
        }
        getc(__stream);
        getc(__stream);
        getc(__stream);
        getc(__stream);
        uVar6 = getc(__stream);
        uVar32 = 2 << (sbyte)(uVar6 & 7);
        uVar34 = (ulong)uVar32;
        getc(__stream);
        getc(__stream);
        if ((char)uVar6 < '\0') {
          uVar30 = 0;
          do {
            iVar37 = getc(__stream);
            local_3648[uVar30] = (byte)iVar37;
            iVar37 = getc(__stream);
            local_3748[uVar30] = (byte)iVar37;
            iVar37 = getc(__stream);
            local_3848[uVar30] = (byte)iVar37;
            uVar30 = uVar30 + 1;
          } while (uVar34 != uVar30);
        }
        else {
          iVar37 = 0;
          (*Fl::warning)("%s does not have a colormap.",infname);
          uVar30 = 0;
          do {
            bVar5 = (byte)(iVar37 / (int)(uVar32 - 1));
            local_3848[uVar30] = bVar5;
            local_3748[uVar30] = bVar5;
            local_3648[uVar30] = bVar5;
            uVar30 = uVar30 + 1;
            iVar37 = iVar37 + 0xff;
          } while (uVar34 != uVar30);
        }
        bVar3 = false;
        local_38c8 = 0;
        while (uVar32 = getc(__stream), (char)uVar32 != ',') {
          if ((uVar32 & 0xff) == 0x21) {
            uVar7 = getc(__stream);
            uVar32 = getc(__stream);
            uVar32 = uVar32 & 0xff;
            if (uVar32 == 4 && (uVar7 & 0xff) == 0xf9) {
              uVar32 = getc(__stream);
              getc(__stream);
              getc(__stream);
              local_38c8 = getc(__stream);
              if ((uVar32 & 1) != 0) {
                bVar3 = true;
              }
              uVar32 = getc(__stream);
              uVar32 = uVar32 & 0xff;
            }
            else if ((uVar7 | 0xffffff00) < 0xfffffffe) {
              (*Fl::warning)("%s: unknown gif extension 0x%02x.",infname);
            }
            for (; uVar32 != 0; uVar32 = uVar32 & 0xff) {
              do {
                getc(__stream);
                uVar32 = uVar32 - 1;
              } while (uVar32 != 0);
              uVar32 = getc(__stream);
            }
          }
          else {
            (*Fl::warning)("%s: unknown gif code 0x%02x",infname,(ulong)(uVar32 & 0xff));
          }
        }
        getc(__stream);
        getc(__stream);
        getc(__stream);
        getc(__stream);
        uVar32 = getc(__stream);
        uVar7 = getc(__stream);
        iVar37 = (uVar7 & 0xff) * 0x100;
        uVar7 = iVar37 + (uVar32 & 0xff);
        uVar30 = (ulong)uVar7;
        uVar8 = getc(__stream);
        uVar9 = getc(__stream);
        iVar10 = (uVar9 & 0xff) * 0x100;
        uVar9 = iVar10 + (uVar8 & 0xff);
        uVar11 = getc(__stream);
        if ((char)(byte)uVar11 < '\0') {
          uVar39 = 0;
          do {
            iVar12 = getc(__stream);
            local_3648[uVar39] = (byte)iVar12;
            iVar12 = getc(__stream);
            local_3748[uVar39] = (byte)iVar12;
            iVar12 = getc(__stream);
            local_3848[uVar39] = (byte)iVar12;
            uVar39 = uVar39 + 1;
          } while ((uint)(2 << ((byte)uVar11 & 7)) != uVar39);
        }
        uVar13 = getc(__stream);
        uVar33 = 1 << ((byte)uVar13 & 0x1f);
        if ((uVar13 & 0xff) <= (uVar6 & 7)) {
          uVar34 = (ulong)uVar33;
        }
        uVar39 = (ulong)(uVar9 * uVar7);
        pcVar16 = (char *)operator_new__(uVar39);
        iVar12 = (uVar13 & 0xff) + 1;
        local_3898 = pcVar16 + uVar30;
        uVar27 = ~(-2 << ((byte)uVar13 & 0x1f));
        uVar6 = getc(__stream);
        uVar14 = getc(__stream);
        uVar38 = (uVar6 & 0xff) - 1;
        iVar35 = 0;
        bVar5 = 0;
        local_38ec = 0;
        iVar28 = 0;
        pcVar26 = pcVar16;
        uVar6 = uVar27;
        uVar13 = uVar33;
        iVar22 = iVar12;
        uVar29 = uVar33 + 2;
LAB_0020cc59:
        uVar25 = (ulong)uVar13;
        uVar4 = uVar6;
        iVar36 = iVar22;
        do {
          uVar24 = uVar29;
          iVar22 = iVar36;
          uVar6 = uVar4;
          uVar31 = uVar25;
          uVar13 = uVar14 & 0xff;
          uVar29 = iVar28 + iVar22;
          if (7 < (int)uVar29) {
            if ((int)uVar38 < 1) {
              uVar38 = getc(__stream);
              uVar38 = uVar38 & 0xff;
              if (uVar38 == 0) goto LAB_0020cf20;
            }
            uVar14 = getc(__stream);
            uVar38 = uVar38 - 1;
            uVar13 = uVar13 | (uVar14 & 0xff) << 8;
            if (0xf < uVar29) {
              if (uVar38 == 0) {
                uVar38 = getc(__stream);
                uVar38 = uVar38 & 0xff;
                if (uVar38 == 0) goto LAB_0020cf20;
              }
              uVar14 = getc(__stream);
              uVar38 = uVar38 - 1;
              uVar13 = uVar13 | (uVar14 & 0xff) << 0x10;
            }
          }
          uVar13 = uVar13 >> ((byte)iVar28 & 0x1f) & uVar6;
          iVar28 = (int)uVar29 % 8;
          uVar25 = (ulong)uVar33;
          uVar4 = uVar27;
          iVar36 = iVar12;
          uVar29 = uVar33 + 2;
        } while (uVar13 == uVar33);
        if (uVar13 == uVar33 + 1) goto LAB_0020cf20;
        pcVar23 = local_3448;
        uVar25 = (ulong)uVar13;
        if ((int)uVar24 <= (int)uVar13) {
          if (uVar13 != uVar24) {
            (*Fl::error)("Fl_GIF_Image: %s - LZW Barf!",infname);
LAB_0020cf20:
            (this->super_Fl_Pixmap).super_Fl_Image.w_ = uVar7;
            (this->super_Fl_Pixmap).super_Fl_Image.h_ = uVar9;
            (this->super_Fl_Pixmap).super_Fl_Image.d_ = 1;
            ppcVar17 = (char **)operator_new__((ulong)(uVar9 * 8 + 0x10));
            bVar20 = local_3648[0];
            bVar5 = local_3748[0];
            cVar1 = (char)local_38c8;
            if ((bVar3) && (cVar1 != '\0')) {
              if (uVar39 != 0) {
                pcVar26 = pcVar16 + uVar39;
                do {
                  pcVar23 = pcVar26 + -1;
                  pcVar26 = pcVar26 + -1;
                  if (*pcVar23 == cVar1) {
                    cVar21 = '\0';
LAB_0020cf95:
                    *pcVar26 = cVar21;
                  }
                  else {
                    cVar21 = cVar1;
                    if (*pcVar23 == '\0') goto LAB_0020cf95;
                  }
                } while (pcVar16 < pcVar26);
              }
              local_38c8 = local_38c8 & 0xff;
              local_3648[0] = local_3648[local_38c8];
              local_3648[local_38c8] = bVar20;
              local_3748[0] = local_3748[local_38c8];
              local_3748[local_38c8] = bVar5;
              bVar5 = local_3848[local_38c8];
              local_3848[local_38c8] = local_3848[0];
              local_3848[0] = bVar5;
            }
            iVar12 = 0;
            memset(local_3448,0,uVar34);
            pcVar26 = pcVar16 + uVar39;
            pcVar23 = pcVar26;
            if (uVar39 != 0) {
              do {
                pcVar18 = pcVar23 + -1;
                local_3448[(byte)pcVar23[-1]] = '\x01';
                pcVar23 = pcVar18;
              } while (pcVar16 < pcVar18);
            }
            bVar5 = (local_3448[0] != '\0' && bVar3) ^ 0x21;
            sVar15 = 0;
            do {
              if (local_3448[sVar15] != '\0') {
                abStack_3548[sVar15] = bVar5;
                bVar5 = bVar5 + 1;
                iVar12 = iVar12 + 1;
              }
              sVar15 = sVar15 + 1;
            } while (uVar34 != sVar15);
            iVar35 = sprintf(local_1038,"%d %d %d %d",uVar30,(ulong)uVar9,(ulong)(uint)-iVar12,1);
            pcVar23 = (char *)operator_new__((long)(iVar35 + 1));
            *ppcVar17 = pcVar23;
            strcpy(pcVar23,local_1038);
            pbVar19 = (byte *)operator_new__((long)(iVar12 << 2));
            ppcVar17[1] = (char *)pbVar19;
            sVar15 = 0;
            do {
              if (local_3448[sVar15] != '\0') {
                *pbVar19 = abStack_3548[sVar15];
                pbVar19[1] = local_3648[sVar15];
                pbVar19[2] = local_3748[sVar15];
                pbVar19[3] = local_3848[sVar15];
                pbVar19 = pbVar19 + 4;
              }
              sVar15 = sVar15 + 1;
            } while (uVar34 != sVar15);
            if (uVar39 != 0) {
              do {
                pcVar26[-1] = abStack_3548[(byte)pcVar26[-1]];
                pcVar26 = pcVar26 + -1;
              } while (pcVar16 < pcVar26);
            }
            if (uVar9 != 0) {
              uVar34 = 0;
              pcVar26 = pcVar16;
              do {
                pcVar23 = (char *)operator_new__((ulong)(uVar7 + 1));
                ppcVar17[uVar34 + 2] = pcVar23;
                memcpy(pcVar23,pcVar26,uVar30);
                pcVar23[uVar30] = '\0';
                uVar34 = uVar34 + 1;
                pcVar26 = pcVar26 + (iVar37 + (uVar32 & 0xff));
              } while (iVar10 + (uVar8 & 0xff) != uVar34);
            }
            (this->super_Fl_Pixmap).super_Fl_Image.data_ = ppcVar17;
            (this->super_Fl_Pixmap).super_Fl_Image.count_ = uVar9 + 2;
            (this->super_Fl_Pixmap).alloc_data = 1;
            operator_delete__(pcVar16);
            fclose(__stream);
            return;
          }
          local_3448[0] = (char)local_38ec;
          pcVar23 = local_3448 + 1;
          uVar25 = uVar31;
        }
        local_38ec = (uint)uVar25;
        while ((int)uVar34 <= (int)local_38ec) {
          *pcVar23 = local_1038[uVar25];
          pcVar23 = pcVar23 + 1;
          local_38ec = (uint)(short)(&local_3038)[uVar25];
          uVar25 = (ulong)local_38ec;
        }
        *pcVar23 = (char)local_38ec;
        pcVar23 = pcVar23 + 1;
        iVar36 = iVar35;
        do {
          *pcVar26 = pcVar23[-1];
          pcVar26 = pcVar26 + 1;
          if (local_3898 <= pcVar26) {
            if ((uVar11 & 0x40) == 0) {
              iVar35 = iVar35 + 1;
              iVar36 = iVar35;
            }
            else {
              switch(bVar5) {
              case 0:
                iVar35 = iVar35 + 8;
                bVar5 = (int)uVar9 <= iVar35;
                iVar36 = iVar35;
                if ((int)uVar9 <= iVar35) {
                  iVar35 = 4;
                  iVar36 = iVar35;
                }
                break;
              case 1:
                iVar36 = iVar35 + 8;
                iVar35 = iVar36;
                if ((int)uVar9 <= iVar36) {
                  iVar35 = 2;
                }
                bVar5 = ((int)uVar9 <= iVar36) + 1;
                iVar36 = iVar35;
                break;
              case 2:
                iVar35 = iVar35 + 4;
                bVar2 = iVar35 < (int)uVar9;
                if ((int)uVar9 <= iVar35) {
                  iVar35 = 1;
                }
                bVar5 = bVar2 ^ 3;
                iVar36 = iVar35;
                break;
              case 3:
                iVar35 = iVar35 + 2;
                bVar5 = 3;
                iVar36 = iVar35;
              }
            }
            bVar2 = (int)uVar9 <= iVar35;
            iVar35 = iVar36;
            if (bVar2) {
              iVar35 = 0;
            }
            pcVar26 = pcVar16 + (int)(iVar35 * uVar7);
            local_3898 = pcVar26 + uVar30;
            iVar36 = iVar35;
          }
          pcVar23 = pcVar23 + -1;
        } while (local_3448 < pcVar23);
        uVar29 = uVar24;
        if ((uint)uVar31 != uVar33) {
          (&local_3038)[(int)uVar24] = (short)uVar31;
          local_1038[(int)uVar24] = (char)local_38ec;
          uVar29 = uVar24 + 1;
          if (((int)uVar6 <= (int)uVar24) && (uVar29 = uVar24, iVar22 < 0xc)) {
            bVar20 = (byte)iVar22;
            iVar22 = iVar22 + 1;
            uVar6 = (2 << (bVar20 & 0x1f)) - 1;
            uVar29 = uVar24 + 1;
          }
        }
        goto LAB_0020cc59;
      }
      fclose(__stream);
      iVar37 = -3;
      (*Fl::error)("Fl_GIF_Image: %s is not a GIF file.\n",infname);
    }
    (this->super_Fl_Pixmap).super_Fl_Image.ld_ = iVar37;
  }
  return;
}

Assistant:

Fl_GIF_Image::Fl_GIF_Image(const char *infname) : Fl_Pixmap((char *const*)0) {
  FILE *GifFile;	// File to read
  char **new_data;	// Data array

  if ((GifFile = fl_fopen(infname, "rb")) == NULL) {
    Fl::error("Fl_GIF_Image: Unable to open %s!", infname);
    ld(ERR_FILE_ACCESS);
    return;
  }

  {char b[6];
  if (fread(b,1,6,GifFile)<6) {
    fclose(GifFile);
    ld(ERR_FILE_ACCESS);
    return; /* quit on eof */
  }
  if (b[0]!='G' || b[1]!='I' || b[2] != 'F') {
    fclose(GifFile);
    Fl::error("Fl_GIF_Image: %s is not a GIF file.\n", infname);
    ld(ERR_FORMAT);
    return;
  }
  if (b[3]!='8' || b[4]>'9' || b[5]!= 'a')
    Fl::warning("%s is version %c%c%c.",infname,b[3],b[4],b[5]);
  }

  int Width; GETSHORT(Width);
  int Height; GETSHORT(Height);

  uchar ch = NEXTBYTE;
  char HasColormap = ((ch & 0x80) != 0);
  int BitsPerPixel = (ch & 7) + 1;
  int ColorMapSize = 1 << BitsPerPixel;
  // int OriginalResolution = ((ch>>4)&7)+1;
  // int SortedTable = (ch&8)!=0;
  ch = NEXTBYTE; // Background Color index
  ch = NEXTBYTE; // Aspect ratio is N/64

  // Read in global colormap:
  uchar transparent_pixel = 0;
  char has_transparent = 0;
  uchar Red[256], Green[256], Blue[256]; /* color map */
  if (HasColormap) {
    for (int i=0; i < ColorMapSize; i++) {	
      Red[i] = NEXTBYTE;
      Green[i] = NEXTBYTE;
      Blue[i] = NEXTBYTE;
    }
  } else {
    Fl::warning("%s does not have a colormap.", infname);
    for (int i = 0; i < ColorMapSize; i++)
      Red[i] = Green[i] = Blue[i] = (uchar)(255 * i / (ColorMapSize-1));
  }

  int CodeSize;		/* Code size, init from GIF header, increases... */
  char Interlace;

  for (;;) {

    int i = NEXTBYTE;
    if (i<0) {
      fclose(GifFile);
      Fl::error("Fl_GIF_Image: %s - unexpected EOF",infname); 
      w(0); h(0); d(0); ld(ERR_FORMAT);
      return;
    }
    int blocklen;

    //  if (i == 0x3B) return 0;  eof code

    if (i == 0x21) {		// a "gif extension"

      ch = NEXTBYTE;
      blocklen = NEXTBYTE;

      if (ch==0xF9 && blocklen==4) { // Netscape animation extension

	char bits;
	bits = NEXTBYTE;
	getc(GifFile); getc(GifFile); // GETSHORT(delay);
	transparent_pixel = NEXTBYTE;
	if (bits & 1) has_transparent = 1;
	blocklen = NEXTBYTE;

      } else if (ch == 0xFF) { // Netscape repeat count
	;

      } else if (ch != 0xFE) { //Gif Comment
	Fl::warning("%s: unknown gif extension 0x%02x.", infname, ch);
      }
    } else if (i == 0x2c) {	// an image

      ch = NEXTBYTE; ch = NEXTBYTE; // GETSHORT(x_position);
      ch = NEXTBYTE; ch = NEXTBYTE; // GETSHORT(y_position);
      GETSHORT(Width);
      GETSHORT(Height);
      ch = NEXTBYTE;
      Interlace = ((ch & 0x40) != 0);
      if (ch&0x80) { 
	// read local color map
	int n = 2<<(ch&7);
	for (i=0; i < n; i++) {	
	  Red[i] = NEXTBYTE;
	  Green[i] = NEXTBYTE;
	  Blue[i] = NEXTBYTE;
	}
      }
      CodeSize = NEXTBYTE+1;
      break; // okay, this is the image we want
    } else {
      Fl::warning("%s: unknown gif code 0x%02x", infname, i);
      blocklen = 0;
    }

    // skip the data:
    while (blocklen>0) {while (blocklen--) {ch = NEXTBYTE;} blocklen=NEXTBYTE;}
  }

  if (BitsPerPixel >= CodeSize)
  {
    // Workaround for broken GIF files...
    BitsPerPixel = CodeSize - 1;
    ColorMapSize = 1 << BitsPerPixel;
  }

  uchar *Image = new uchar[Width*Height];

  int YC = 0, Pass = 0; /* Used to de-interlace the picture */
  uchar *p = Image;
  uchar *eol = p+Width;

  int InitCodeSize = CodeSize;
  int ClearCode = (1 << (CodeSize-1));
  int EOFCode = ClearCode + 1;
  int FirstFree = ClearCode + 2;
  int FinChar = 0;
  int ReadMask = (1<<CodeSize) - 1;
  int FreeCode = FirstFree;
  int OldCode = ClearCode;

  // tables used by LZW decompresser:
  short int Prefix[4096];
  uchar Suffix[4096];

  int blocklen = NEXTBYTE;
  uchar thisbyte = NEXTBYTE; blocklen--;
  int frombit = 0;

  for (;;) {

/* Fetch the next code from the raster data stream.  The codes can be
 * any length from 3 to 12 bits, packed into 8-bit bytes, so we have to
 * maintain our location as a pointer and a bit offset.
 * In addition, gif adds totally useless and annoying block counts
 * that must be correctly skipped over. */
    int CurCode = thisbyte;
    if (frombit+CodeSize > 7) {
      if (blocklen <= 0) {
	blocklen = NEXTBYTE;
	if (blocklen <= 0) break;
      }
      thisbyte = NEXTBYTE; blocklen--;
      CurCode |= thisbyte<<8;
    }
    if (frombit+CodeSize > 15) {
      if (blocklen <= 0) {
	blocklen = NEXTBYTE;
	if (blocklen <= 0) break;
      }
      thisbyte = NEXTBYTE; blocklen--;
      CurCode |= thisbyte<<16;
    }
    CurCode = (CurCode>>frombit)&ReadMask;
    frombit = (frombit+CodeSize)%8;

    if (CurCode == ClearCode) {
      CodeSize = InitCodeSize;
      ReadMask = (1<<CodeSize) - 1;
      FreeCode = FirstFree;
      OldCode = ClearCode;
      continue;
    }

    if (CurCode == EOFCode) break;

    uchar OutCode[1025]; // temporary array for reversing codes
    uchar *tp = OutCode;
    int i;
    if (CurCode < FreeCode) i = CurCode;
    else if (CurCode == FreeCode) {*tp++ = (uchar)FinChar; i = OldCode;}
    else {Fl::error("Fl_GIF_Image: %s - LZW Barf!", infname); break;}

    while (i >= ColorMapSize) {*tp++ = Suffix[i]; i = Prefix[i];}
    *tp++ = FinChar = i;
    do {
      *p++ = *--tp;
      if (p >= eol) {
	if (!Interlace) YC++;
	else switch (Pass) {
	case 0: YC += 8; if (YC >= Height) {Pass++; YC = 4;} break;
	case 1: YC += 8; if (YC >= Height) {Pass++; YC = 2;} break;
	case 2: YC += 4; if (YC >= Height) {Pass++; YC = 1;} break;
	case 3: YC += 2; break;
	}
	if (YC>=Height) YC=0; /* cheap bug fix when excess data */
	p = Image + YC*Width;
	eol = p+Width;
      }
    } while (tp > OutCode);

    if (OldCode != ClearCode) {
      Prefix[FreeCode] = (short)OldCode;
      Suffix[FreeCode] = FinChar;
      FreeCode++;
      if (FreeCode > ReadMask) {
	if (CodeSize < 12) {
	  CodeSize++;
	  ReadMask = (1 << CodeSize) - 1;
	}
	else FreeCode--;
      }
    }
    OldCode = CurCode;
  }

  // We are done reading the file, now convert to xpm:

  // allocate line pointer arrays:
  w(Width);
  h(Height);
  d(1);
  new_data = new char*[Height+2];

  // transparent pixel must be zero, swap if it isn't:
  if (has_transparent && transparent_pixel != 0) {
    // swap transparent pixel with zero
    p = Image+Width*Height;
    while (p-- > Image) {
      if (*p==transparent_pixel) *p = 0;
      else if (!*p) *p = transparent_pixel;
    }
    uchar t;
    t                        = Red[0];
    Red[0]                   = Red[transparent_pixel];
    Red[transparent_pixel]   = t;

    t                        = Green[0];
    Green[0]                 = Green[transparent_pixel];
    Green[transparent_pixel] = t;

    t                        = Blue[0];
    Blue[0]                  = Blue[transparent_pixel];
    Blue[transparent_pixel]  = t;
  }

  // find out what colors are actually used:
  uchar used[256]; uchar remap[256];
  int i;
  for (i = 0; i < ColorMapSize; i++) used[i] = 0;
  p = Image+Width*Height;
  while (p-- > Image) used[*p] = 1;

  // remap them to start with printing characters:
  int base = has_transparent && used[0] ? ' ' : ' '+1;
  int numcolors = 0;
  for (i = 0; i < ColorMapSize; i++) if (used[i]) {
    remap[i] = (uchar)(base++);
    numcolors++;
  }

  // write the first line of xpm data (use suffix as temp array):
  int length = sprintf((char*)(Suffix),
		       "%d %d %d %d",Width,Height,-numcolors,1);
  new_data[0] = new char[length+1];
  strcpy(new_data[0], (char*)Suffix);

  // write the colormap
  new_data[1] = (char*)(p = new uchar[4*numcolors]);
  for (i = 0; i < ColorMapSize; i++) if (used[i]) {
    *p++ = remap[i];
    *p++ = Red[i];
    *p++ = Green[i];
    *p++ = Blue[i];
  }

  // remap the image data:
  p = Image+Width*Height;
  while (p-- > Image) *p = remap[*p];

  // split the image data into lines:
  for (i=0; i<Height; i++) {
    new_data[i+2] = new char[Width+1];
    memcpy(new_data[i + 2], (char*)(Image + i*Width), Width);
    new_data[i + 2][Width] = 0;
  }

  data((const char **)new_data, Height + 2);
  alloc_data = 1;

  delete[] Image;

  fclose(GifFile);
}